

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
          (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
           *this,TokenType t1,TokenType others,TokenType others_1)

{
  bool bVar1;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                     *)this,t1);
  if (bVar1) {
    return true;
  }
  bVar1 = matchesAny<soul::TokenType,soul::TokenType>(this,others,others_1);
  return bVar1;
}

Assistant:

bool matchesAny (Type1 t1, Args... others) const            { return matches (t1) || matchesAny (others...); }